

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O0

void ext_idx12_x_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  byte bVar1;
  m680x_info *in_RDX;
  MCInst *in_RSI;
  uint16_t imm16;
  cs_m680x_op *op0;
  cs_m680x *m680x;
  uint16_t local_2a;
  cs_m680x_op *local_28;
  
  bVar1 = in_RSI->Operands[0].field_0x5;
  in_RSI->Operands[0].field_0x5 = bVar1 + 1;
  local_28 = (cs_m680x_op *)((long)in_RSI->Operands + (ulong)bVar1 * 0x18 + 8);
  local_2a = 0;
  indexed12_hdlr(in_RSI,in_RDX,(uint16_t *)&in_RSI->Operands[0].Kind);
  read_word((m680x_info *)in_RSI,&local_2a,*(uint16_t *)&in_RDX->code);
  local_28->type = M680X_OP_EXTENDED;
  (local_28->field_1).rel.address = local_2a;
  set_operand_size((m680x_info *)in_RSI,local_28,'\x01');
  return;
}

Assistant:

static void ext_idx12_x_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	cs_m680x *m680x = &info->m680x;
	cs_m680x_op *op0 = &m680x->operands[m680x->op_count++];
	uint16_t imm16 = 0;

	indexed12_hdlr(MI, info, address);
	read_word(info, &imm16, *address);
	op0->type = M680X_OP_EXTENDED;
	op0->ext.address = (int16_t)imm16;
	set_operand_size(info, op0, 1);
}